

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

Integer pnga_read_inc(Integer g_a,Integer *subscript,Integer inc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Integer IVar6;
  uint uVar7;
  long lVar8;
  short *psVar9;
  long lVar10;
  C_Integer CVar11;
  global_array_t *pgVar12;
  Integer _d;
  long lVar13;
  long *ploc;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  void *prem;
  bool bVar19;
  long lvalue;
  int ivalue;
  Integer ldp [7];
  Integer local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0 [8];
  long lStack_190;
  undefined8 local_188;
  Integer local_148;
  long local_140;
  long local_138 [33];
  
  lVar18 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar18)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_read_inc");
    pnga_error((char *)local_138,g_a);
  }
  local_1e8 = lVar18 * 0x368;
  if (GA[lVar18].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_read_inc");
    pnga_error((char *)local_138,g_a);
  }
  iVar3 = *(int *)((long)GA->dims + local_1e8 + -0x2c);
  uVar7 = iVar3 - 0x3e9;
  if ((0xf < uVar7) || ((0x8003U >> (uVar7 & 0x1f) & 1) == 0)) {
    pnga_error("type must be integer",(long)iVar3);
  }
  GAstat.numrdi = GAstat.numrdi + 1;
  GAbytes.rditot = GAbytes.rditot + 8.0;
  local_1d8 = (long)*(int *)((long)GA->block_dims + local_1e8 + -0x18);
  sVar1 = *(short *)((long)GA->dims + local_1e8 + -0x30);
  lVar18 = (long)sVar1;
  pnga_locate(g_a,subscript,&local_1f0);
  pgVar12 = GA;
  local_148 = inc;
  if (*(int *)((long)GA->block_dims + local_1e8 + -4) == 0) {
    psVar9 = (short *)((long)GA->dims + local_1e8 + -0x30);
    sVar2 = *psVar9;
    lVar8 = (long)sVar2;
    local_1e0 = lVar8 + -1;
    lVar5 = local_1e8;
    if (*(long *)(psVar9 + 0x154) == 0) {
      if (0 < sVar2) {
        lVar13 = 1;
        lVar10 = 0;
        do {
          lVar13 = lVar13 * GA[g_a + 1000].nblock[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar8 != lVar10);
        if (local_1f0 < 0 || lVar13 <= local_1f0) {
          if (0 < sVar2) {
            memset(local_1d0 + 1,0,lVar8 << 3);
            memset(&local_188,0xff,lVar8 << 3);
LAB_00176407:
            local_1d0[0] = g_a;
            lVar13 = 0;
            lVar5 = local_1e8;
            do {
              if ((long)(&local_188)[lVar13] < subscript[lVar13] ||
                  subscript[lVar13] < local_1d0[lVar13 + 1]) {
                sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
                pnga_error((char *)local_138,lVar13);
                pgVar12 = GA;
                lVar5 = local_1e8;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(short *)((long)pgVar12->dims + lVar5 + -0x30));
            psVar9 = (short *)((long)pgVar12->dims + lVar5 + -0x30);
            g_a = local_1d0[0];
          }
        }
        else if (0 < sVar2) {
          lVar13 = *(long *)(psVar9 + 0xf4);
          lVar10 = 0;
          lVar14 = 0;
          IVar6 = local_1f0;
          do {
            lVar15 = (long)GA[g_a + 1000].nblock[lVar10];
            lVar17 = lVar13 + (IVar6 % lVar15) * 8;
            local_1d0[lVar10 + 1] = *(undefined8 *)(lVar17 + lVar14 * 8);
            if (IVar6 % lVar15 == lVar15 + -1) {
              CVar11 = GA[g_a + 1000].dims[lVar10];
            }
            else {
              CVar11 = *(long *)(lVar17 + 8 + lVar14 * 8) + -1;
            }
            lVar14 = lVar14 + lVar15;
            (&local_188)[lVar10] = CVar11;
            lVar10 = lVar10 + 1;
            IVar6 = IVar6 / lVar15;
          } while (lVar8 != lVar10);
          if (0 < sVar2) goto LAB_00176407;
        }
      }
      if (local_1e0 == 0) {
        local_138[0] = (CONCAT44(local_188._4_4_,(int)local_188) - local_1d0[1]) +
                       *(long *)(psVar9 + 0x60) * 2 + 1;
      }
      if (sVar2 < 2) {
        lVar13 = 1;
        lVar10 = 0;
      }
      else {
        lVar13 = 1;
        lVar10 = 0;
        lVar14 = 0;
        do {
          lVar10 = lVar10 + ((pgVar12[g_a + 1000].width[lVar14] + subscript[lVar14]) -
                            local_1d0[lVar14 + 1]) * lVar13;
          lVar17 = ((pgVar12[g_a + 1000].width[lVar14] * 2 + 1) - local_1d0[lVar14 + 1]) +
                   (&local_188)[lVar14];
          local_138[lVar14] = lVar17;
          lVar13 = lVar13 * lVar17;
          lVar14 = lVar14 + 1;
        } while (local_1e0 != lVar14);
      }
      lVar10 = ((subscript[lVar8 + -1] - local_1d0[lVar8]) + *(long *)(psVar9 + lVar8 * 4 + 0x5c)) *
               lVar13 + lVar10;
      if (*(int *)(psVar9 + 0x108) == 0) {
        lVar8 = (long)PGRP_LIST->inv_map_proc_list[local_1f0];
      }
      else {
        lVar8 = local_1f0;
        if (*(long *)(psVar9 + 0x154) != 0) {
          lVar8 = *(long *)(psVar9 + 0x150);
          goto LAB_00176553;
        }
      }
    }
    else {
      lVar13 = *(long *)(*(long *)(psVar9 + 0x160) + local_1f0 * 8);
      if (lVar13 < *(long *)(psVar9 + 0x154)) {
        if (0 < sVar2) {
          lVar10 = 1;
          lVar14 = 0;
          do {
            lVar10 = lVar10 * GA[g_a + 1000].nblock[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar8 != lVar14);
          if (lVar13 < 0 || lVar10 <= lVar13) goto joined_r0x001761e6;
          if (sVar2 < 1) goto LAB_00176296;
          local_1d0[0] = g_a;
          lVar5 = *(long *)(psVar9 + 0xf4);
          lVar10 = 0;
          lVar14 = 0;
          do {
            lVar15 = (long)GA[g_a + 1000].nblock[lVar14];
            lVar17 = lVar5 + (lVar13 % lVar15) * 8;
            local_1d0[lVar14 + 1] = *(undefined8 *)(lVar17 + lVar10 * 8);
            if (lVar13 % lVar15 == lVar15 + -1) {
              CVar11 = GA[g_a + 1000].dims[lVar14];
            }
            else {
              CVar11 = *(long *)(lVar17 + 8 + lVar10 * 8) + -1;
            }
            lVar10 = lVar10 + lVar15;
            (&local_188)[lVar14] = CVar11;
            lVar14 = lVar14 + 1;
            lVar13 = lVar13 / lVar15;
          } while (lVar8 != lVar14);
          goto LAB_0017621a;
        }
      }
      else {
joined_r0x001761e6:
        if (0 < sVar2) {
          local_1d0[0] = g_a;
          memset(local_1d0 + 1,0,lVar8 * 8);
          memset(&local_188,0xff,lVar8 * 8);
LAB_0017621a:
          lVar13 = 0;
          lVar5 = local_1e8;
          do {
            if ((long)(&local_188)[lVar13] < subscript[lVar13] ||
                subscript[lVar13] < local_1d0[lVar13 + 1]) {
              sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
              pnga_error((char *)local_138,lVar13);
              pgVar12 = GA;
              lVar5 = local_1e8;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(short *)((long)pgVar12->dims + lVar5 + -0x30));
          psVar9 = (short *)((long)pgVar12->dims + lVar5 + -0x30);
          g_a = local_1d0[0];
        }
      }
LAB_00176296:
      if (local_1e0 == 0) {
        local_138[0] = (CONCAT44(local_188._4_4_,(int)local_188) - local_1d0[1]) +
                       *(long *)(psVar9 + 0x60) * 2 + 1;
      }
      if (sVar2 < 2) {
        lVar13 = 1;
        lVar10 = 0;
      }
      else {
        lVar13 = 1;
        lVar14 = 0;
        lVar10 = 0;
        do {
          lVar10 = lVar10 + ((pgVar12[g_a + 1000].width[lVar14] + subscript[lVar14]) -
                            local_1d0[lVar14 + 1]) * lVar13;
          lVar17 = ((pgVar12[g_a + 1000].width[lVar14] * 2 + 1) - local_1d0[lVar14 + 1]) +
                   (&local_188)[lVar14];
          local_138[lVar14] = lVar17;
          lVar13 = lVar13 * lVar17;
          lVar14 = lVar14 + 1;
        } while (local_1e0 != lVar14);
      }
      lVar10 = ((subscript[lVar8 + -1] - local_1d0[lVar8]) + *(long *)(psVar9 + lVar8 * 4 + 0x5c)) *
               lVar13 + lVar10;
      if (*(int *)(psVar9 + 0x108) == 0) {
        lVar8 = (long)PGRP_LIST->inv_map_proc_list
                      [*(long *)(*(long *)(psVar9 + 0x160) + local_1f0 * 8)];
      }
      else if (*(long *)(psVar9 + 0x154) == 0) {
        lVar8 = *(long *)(psVar9 + 0x160);
LAB_00176553:
        lVar8 = *(long *)(lVar8 + local_1f0 * 8);
      }
      else {
        lVar8 = *(long *)(*(long *)(psVar9 + 0x150) +
                         *(long *)(*(long *)(psVar9 + 0x160) + local_1f0 * 8) * 8);
      }
    }
    prem = (void *)(lVar10 * *(int *)(psVar9 + 0xc) +
                   *(long *)(*(long *)(psVar9 + 0xf0) + lVar8 * 8));
  }
  else {
    pnga_distribution(g_a,local_1f0,local_1d0 + 1,&local_188);
    pnga_access_block_ptr(g_a,local_1f0,&local_140,local_138);
    if (sVar1 < 2) {
      lVar5 = 1;
      lVar8 = 0;
    }
    else {
      lVar5 = 1;
      lVar8 = 0;
      lVar13 = 0;
      do {
        lVar8 = lVar8 + (subscript[lVar13] - local_1d0[lVar13 + 1]) * lVar5;
        lVar5 = lVar5 * local_138[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar18 + -1 != lVar13);
    }
    prem = (void *)((long)*(int *)((long)GA->dims + local_1e8 + -0x18) *
                    ((subscript[lVar18 + -1] - local_1d0[lVar18]) * lVar5 + lVar8) + local_140);
    pgVar12 = GA;
    lVar5 = local_1e8;
  }
  iVar3 = *(int *)((long)pgVar12->dims + lVar5 + -0x2c);
  if (GAme == local_1f0) {
    GAbytes.rdiloc = GAbytes.rdiloc + 8.0;
  }
  iVar4 = *(int *)((long)pgVar12->block_dims + lVar5 + -4);
  if (iVar4 - 3U < 2) {
    sVar2 = *(short *)((long)pgVar12->dims + lVar5 + -0x30);
    uVar7 = (uint)sVar2;
    lVar5 = (long)(int)local_1f0 % *(long *)((long)pgVar12->num_blocks + lVar5);
    local_1d0[1] = lVar5;
    if (1 < (int)uVar7) {
      lVar8 = 0;
      do {
        local_1f0 = ((int)local_1f0 - lVar5) / pgVar12[g_a + 1000].num_blocks[lVar8];
        lVar5 = (long)(int)local_1f0 % pgVar12[g_a + 1000].num_blocks[lVar8 + 1];
        local_1d0[lVar8 + 2] = lVar5;
        lVar8 = lVar8 + 1;
      } while ((ulong)uVar7 - 1 != lVar8);
    }
    lVar5 = (long)(int)uVar7;
    if (0 < sVar1) {
      lVar8 = 0;
      do {
        local_1d0[lVar8 + 1] = local_1d0[lVar8 + 1] % (long)pgVar12[g_a + 1000].nblock[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar18 != lVar8);
    }
    if (0 < sVar2) {
      uVar16 = 0;
      do {
        (&local_188)[uVar16] = local_1d0[uVar16 + 1] % (long)pgVar12[g_a + 1000].nblock[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar7 != uVar16);
      local_1f0 = (&lStack_190)[lVar5];
      if (1 < sVar2) {
        uVar16 = (ulong)(uVar7 - 2);
        do {
          local_1f0 = local_1f0 * pgVar12[g_a + 1000].nblock[uVar16] + (&local_188)[uVar16];
          bVar19 = uVar16 != 0;
          uVar16 = uVar16 - 1;
        } while (bVar19);
      }
      goto LAB_00176877;
    }
  }
  else {
    if (iVar4 != 2) {
      if (iVar4 == 1) {
        IVar6 = pnga_nnodes();
        local_1f0 = local_1f0 % IVar6;
      }
      goto LAB_00176877;
    }
    sVar2 = *(short *)((long)pgVar12->dims + lVar5 + -0x30);
    uVar7 = (uint)sVar2;
    lVar5 = (long)(int)local_1f0 % *(long *)((long)pgVar12->num_blocks + lVar5);
    local_1d0[1] = lVar5;
    if (1 < (int)uVar7) {
      lVar8 = 0;
      do {
        local_1f0 = ((int)local_1f0 - lVar5) / pgVar12[g_a + 1000].num_blocks[lVar8];
        lVar5 = (long)(int)local_1f0 % pgVar12[g_a + 1000].num_blocks[lVar8 + 1];
        local_1d0[lVar8 + 2] = lVar5;
        lVar8 = lVar8 + 1;
      } while ((ulong)uVar7 - 1 != lVar8);
    }
    lVar5 = (long)(int)uVar7;
    if (0 < sVar1) {
      lVar8 = 0;
      do {
        local_1d0[lVar8 + 1] = local_1d0[lVar8 + 1] % (long)pgVar12[g_a + 1000].nblock[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar18 != lVar8);
    }
    if (0 < sVar2) {
      uVar16 = 0;
      do {
        (&local_188)[uVar16] = local_1d0[uVar16 + 1] % (long)pgVar12[g_a + 1000].nblock[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar7 != uVar16);
      local_1f0 = (&lStack_190)[lVar5];
      if (1 < sVar2) {
        uVar16 = (ulong)(uVar7 - 2);
        do {
          local_1f0 = local_1f0 * pgVar12[g_a + 1000].nblock[uVar16] + (&local_188)[uVar16];
          bVar19 = uVar16 != 0;
          uVar16 = uVar16 - 1;
        } while (bVar19);
      }
      goto LAB_00176877;
    }
  }
  local_1f0 = (&lStack_190)[lVar5];
LAB_00176877:
  if ((int)local_1d8 != -1) {
    local_1f0 = (Integer)PGRP_LIST[local_1d8].inv_map_proc_list[local_1f0];
  }
  bVar19 = iVar3 == 0x3e9;
  ploc = local_1d0 + 1;
  if (bVar19) {
    ploc = &local_188;
  }
  ARMCI_Rmw(bVar19 ^ 0xd,ploc,prem,(int)local_148,(int)local_1f0);
  if (*(int *)((long)GA->dims + local_1e8 + -0x2c) == 0x3e9) {
    local_1d0[1] = (long)(int)local_188;
  }
  return local_1d0[1];
}

Assistant:

Integer pnga_read_inc(Integer g_a, Integer* subscript, Integer inc)
{
GA_Internal_Threadsafe_Lock();
char *ptr;
Integer ldp[MAXDIM], proc, handle=GA_OFFSET+g_a, p_handle, ndim;
int optype,ivalue;
long lvalue;
void *pval;

    ga_check_handleM(g_a, "nga_read_inc");
    
    /* BJP printf("p[%d] g_a: %d subscript: %d inc: %d\n",GAme, g_a, subscript[0], inc); */

    if(GA[handle].type!=C_INT && GA[handle].type!=C_LONG &&
       GA[handle].type!=C_LONGLONG)
       pnga_error("type must be integer",GA[handle].type);

    GAstat.numrdi++;
    GAbytes.rditot += (double)sizeof(Integer);
    p_handle = GA[handle].p_handle;
    ndim = GA[handle].ndim;

    /* find out who owns it */
    pnga_locate(g_a, subscript, &proc);

    /* get an address of the g_a(subscript) element */
    if (GA[handle].distr_type == REGULAR) {
      if (GA[handle].num_rstrctd == 0) {
        gam_Location(proc, handle,  subscript, (char**)&ptr, ldp);
      } else {
        gam_Location(GA[handle].rank_rstrctd[proc], handle,  subscript, (char**)&ptr, ldp);
      }
    } else {
      Integer lo[MAXDIM], hi[MAXDIM];
      Integer j, jtot, last, offset;
      pnga_distribution(g_a, proc, lo, hi);
      pnga_access_block_ptr(g_a, proc, (char**)&ptr, ldp);
      pnga_release_block(g_a, proc);
      offset = 0;
      last = ndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (subscript[j]-lo[j])*jtot;
        jtot *= ldp[j];
      }
      offset += (subscript[last]-lo[last])*jtot;
      ptr += offset*GA[handle].elemsize;
    }

    if(GA[handle].type==C_INT){
       optype = ARMCI_FETCH_AND_ADD;
       pval = &ivalue;
    }else{
       optype = ARMCI_FETCH_AND_ADD_LONG;
       pval = &lvalue;
    }

    if(GAme == proc)GAbytes.rdiloc += (double)sizeof(Integer);

    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer j, index[MAXDIM];
      gam_find_block_indices(handle, proc, index);
      for (j=0; j<ndim; j++) {
        index[j] = index[j]%GA[handle].nblock[j];
      }
      gam_find_tile_proc_from_indices(handle,proc,index);
    }
    if (p_handle != -1) {   
       proc=PGRP_LIST[p_handle].inv_map_proc_list[proc];
       /*printf("\n%d:proc=%d",GAme,proc);fflush(stdout);*/
    }

    ARMCI_Rmw(optype, pval, (int*)ptr, (int)inc, (int)proc);


   GA_Internal_Threadsafe_Unlock();
   if(GA[handle].type==C_INT)
       return (Integer) ivalue;
   else
       return (Integer) lvalue;
}